

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O1

string * __thiscall
google::protobuf::internal::ExtensionSet::MutableString_abi_cxx11_
          (ExtensionSet *this,int number,FieldType type,FieldDescriptor *descriptor)

{
  Arena *this_00;
  Extension *pEVar1;
  MessageLite *pMVar2;
  pair<google::protobuf::internal::ExtensionSet::Extension_*,_bool> pVar3;
  
  pVar3 = Insert(this,number);
  pEVar1 = pVar3.first;
  pEVar1->descriptor = descriptor;
  if (((undefined1  [16])pVar3 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    pEVar1->type = type;
    pEVar1->is_repeated = false;
    this_00 = this->arena_;
    if (this_00 == (Arena *)0x0) {
      pMVar2 = (MessageLite *)operator_new(0x20);
    }
    else {
      if (this_00->hooks_cookie_ != (void *)0x0) {
        Arena::OnArenaAllocation(this_00,(type_info *)&std::__cxx11::string::typeinfo,0x20);
      }
      pMVar2 = (MessageLite *)
               ArenaImpl::AllocateAlignedAndAddCleanup
                         (&this_00->impl_,0x20,arena_destruct_object<std::__cxx11::string>);
    }
    pMVar2->_vptr_MessageLite = (_func_int **)(pMVar2 + 2);
    pMVar2[1]._vptr_MessageLite = (_func_int **)0x0;
    *(undefined1 *)&pMVar2[2]._vptr_MessageLite = 0;
    (pEVar1->field_0).message_value = pMVar2;
  }
  pEVar1->field_0xa = pEVar1->field_0xa & 0xf0;
  return (string *)(pEVar1->field_0).int64_value;
}

Assistant:

std::string* ExtensionSet::MutableString(int number, FieldType type,
                                         const FieldDescriptor* descriptor) {
  Extension* extension;
  if (MaybeNewExtension(number, descriptor, &extension)) {
    extension->type = type;
    GOOGLE_DCHECK_EQ(cpp_type(extension->type), WireFormatLite::CPPTYPE_STRING);
    extension->is_repeated = false;
    extension->string_value = Arena::Create<std::string>(arena_);
  } else {
    GOOGLE_DCHECK_TYPE(*extension, OPTIONAL_FIELD, STRING);
  }
  extension->is_cleared = false;
  return extension->string_value;
}